

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O0

shared_ptr<adios2::core::Engine>
adios2::core::IO::MakeEngine<adios2::core::engine::NullReader>
          (IO *io,string *name,Mode mode,Comm *comm)

{
  undefined4 in_ECX;
  Mode *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  IO *in_RDI;
  shared_ptr<adios2::core::Engine> sVar1;
  IO *this;
  undefined4 in_stack_ffffffffffffffe0;
  
  this = in_RDI;
  std::
  make_shared<adios2::core::engine::NullReader,adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode_const&,adios2::helper::Comm>
            (in_RDI,in_RSI,in_RDX,(Comm *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
  std::shared_ptr<adios2::core::Engine>::shared_ptr<adios2::core::engine::NullReader,void>
            ((shared_ptr<adios2::core::Engine> *)this,
             (shared_ptr<adios2::core::engine::NullReader> *)in_RDI);
  std::shared_ptr<adios2::core::engine::NullReader>::~shared_ptr
            ((shared_ptr<adios2::core::engine::NullReader> *)0x8c9549);
  sVar1.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<adios2::core::Engine>)
         sVar1.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<Engine> MakeEngine(IO &io, const std::string &name, const Mode mode,
                                              helper::Comm comm)
    {
        return std::make_shared<T>(io, name, mode, std::move(comm));
    }